

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_sse4.c
# Opt level: O3

void av1_fwd_txfm2d_64x64_sse4_1(int16_t *input,int32_t *output,int stride,TX_TYPE tx_type,int bd)

{
  int32_t *piVar1;
  int32_t *piVar2;
  undefined8 *puVar3;
  int *piVar4;
  int *piVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int32_t iVar10;
  int32_t iVar11;
  int32_t iVar12;
  int32_t iVar13;
  int32_t iVar14;
  int32_t iVar15;
  int32_t iVar16;
  int32_t iVar17;
  int32_t iVar18;
  int32_t iVar19;
  int32_t iVar20;
  int32_t iVar21;
  int32_t iVar22;
  int32_t iVar23;
  int iVar24;
  code *pcVar25;
  ulong uVar26;
  int iVar27;
  long lVar28;
  int32_t *piVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  __m128i *output_00;
  uint uVar33;
  int32_t *piVar34;
  __m128i *input_00;
  __m128i round;
  undefined1 auVar35 [16];
  TXFM_2D_FLIP_CFG cfg;
  int32_t txfm_buf [4096];
  TXFM_2D_FLIP_CFG local_4078;
  undefined8 local_4038;
  int aiStack_4030 [2];
  int32_t aiStack_4028 [4094];
  
  av1_get_fwd_txfm_cfg(tx_type,'\x04',&local_4078);
  uVar6 = tx_size_wide[local_4078.tx_size];
  uVar30 = (ulong)uVar6;
  if (local_4078.txfm_type_col == '\x03') {
    pcVar25 = fdct32_sse4_1;
  }
  else if (local_4078.txfm_type_col == '\v') {
    pcVar25 = idtx32x32_sse4_1;
  }
  else if (local_4078.txfm_type_col == '\x04') {
    pcVar25 = fdct64_new_sse4_1;
  }
  else {
    pcVar25 = (code *)0x0;
  }
  uVar33 = uVar6 * uVar6;
  uVar31 = 0;
  piVar29 = output;
  do {
    uVar32 = 0;
    do {
      piVar29[uVar32] = (int)input[uVar32];
      uVar32 = uVar32 + 1;
    } while (uVar30 != uVar32);
    uVar31 = uVar31 + 1;
    piVar29 = piVar29 + uVar30;
    input = input + stride;
  } while (uVar31 != uVar30);
  uVar7 = uVar6 + 3;
  if (-1 < (int)uVar6) {
    uVar7 = uVar6;
  }
  (*pcVar25)(output,&local_4038,(int)local_4078.cos_bit_col);
  iVar27 = (int)local_4078.shift[1];
  if (iVar27 < 0) {
    if (3 < uVar33) {
      iVar24 = 1 << (~local_4078.shift[1] & 0x1fU);
      uVar31 = (ulong)(uVar33 >> 2);
      lVar28 = 0;
      auVar35 = ZEXT416((uint)-iVar27);
      do {
        iVar27 = *(int *)((long)aiStack_4030 + lVar28 + -4);
        iVar8 = *(int *)((long)aiStack_4030 + lVar28);
        iVar9 = *(int *)((long)aiStack_4028 + lVar28 + -4);
        piVar5 = (int *)((long)output + lVar28);
        *piVar5 = *(int *)((long)&local_4038 + lVar28) + iVar24 >> auVar35;
        piVar5[1] = iVar27 + iVar24 >> auVar35;
        piVar5[2] = iVar8 + iVar24 >> auVar35;
        piVar5[3] = iVar9 + iVar24 >> auVar35;
        lVar28 = lVar28 + 0x10;
        uVar31 = uVar31 - 1;
      } while (uVar31 != 0);
    }
  }
  else if (3 < uVar33) {
    uVar31 = (ulong)(uVar33 >> 2);
    lVar28 = 0;
    do {
      iVar24 = *(int *)((long)aiStack_4030 + lVar28 + -4);
      iVar8 = *(int *)((long)aiStack_4030 + lVar28);
      iVar9 = *(int *)((long)aiStack_4028 + lVar28 + -4);
      piVar5 = (int *)((long)output + lVar28);
      *piVar5 = *(int *)((long)&local_4038 + lVar28) << iVar27;
      piVar5[1] = iVar24;
      piVar5[2] = iVar8;
      piVar5[3] = iVar9;
      lVar28 = lVar28 + 0x10;
      uVar31 = uVar31 - 1;
    } while (uVar31 != 0);
  }
  uVar33 = uVar6 >> 2;
  uVar31 = (ulong)uVar33;
  uVar32 = 0;
  piVar29 = output;
  do {
    iVar27 = 0;
    uVar26 = uVar31;
    piVar34 = piVar29;
    do {
      lVar28 = (long)iVar27 * 0x10 + uVar32 * 4 + -0x4038;
      iVar10 = piVar34[1];
      iVar11 = piVar34[2];
      iVar12 = piVar34[3];
      piVar1 = piVar34 + uVar31 * 8;
      iVar13 = *piVar1;
      iVar14 = piVar1[1];
      iVar15 = piVar1[2];
      iVar16 = piVar1[3];
      piVar1 = piVar34 + uVar31 * 4;
      iVar17 = piVar1[1];
      iVar18 = piVar1[2];
      iVar19 = piVar1[3];
      piVar2 = piVar34 + uVar31 * 0xc;
      iVar20 = *piVar2;
      iVar21 = piVar2[1];
      iVar22 = piVar2[2];
      iVar23 = piVar2[3];
      puVar3 = (undefined8 *)((long)&local_4038 + (long)iVar27 * 0x10 + uVar32 * 4);
      *puVar3 = CONCAT44(*piVar1,*piVar34);
      *(int32_t *)(puVar3 + 2) = iVar13;
      *(int32_t *)((long)puVar3 + 0x14) = iVar20;
      piVar1 = (int32_t *)((long)&local_4038 + uVar31 * 0x10 + lVar28 + 0x4038);
      *piVar1 = iVar10;
      piVar1[1] = iVar17;
      piVar1[2] = iVar14;
      piVar1[3] = iVar21;
      puVar3 = (undefined8 *)((long)&local_4038 + (ulong)(uVar33 * 2) * 0x10 + lVar28 + 0x4038);
      *puVar3 = CONCAT44(iVar18,iVar11);
      *(int32_t *)(puVar3 + 2) = iVar15;
      *(int32_t *)((long)puVar3 + 0x14) = iVar22;
      piVar1 = (int32_t *)((long)&local_4038 + (ulong)(uVar33 * 3) * 0x10 + lVar28 + 0x4038);
      *piVar1 = iVar12;
      piVar1[1] = iVar19;
      piVar1[2] = iVar16;
      piVar1[3] = iVar23;
      iVar27 = iVar27 + (uVar6 & 0x7ffffffc);
      piVar34 = piVar34 + 4;
      uVar26 = uVar26 - 1;
    } while (uVar26 != 0);
    uVar32 = uVar32 + 4;
    piVar29 = piVar29 + uVar31 * 0x10;
  } while (uVar32 < uVar30);
  uVar33 = (int)uVar7 >> 3;
  input_00 = (__m128i *)&local_4038;
  if (0 < (int)uVar33) {
    uVar30 = (ulong)uVar33;
    output_00 = (__m128i *)output;
    do {
      av1_fdct64_sse4_1(input_00,output_00,local_4078.cos_bit_row,(int)uVar7 >> 2,uVar33);
      output_00 = output_00 + 1;
      input_00 = input_00 + 1;
      uVar30 = uVar30 - 1;
    } while (uVar30 != 0);
  }
  uVar33 = uVar33 * ((int)uVar6 >> 1);
  iVar27 = (int)local_4078.shift[2];
  if (iVar27 < 0) {
    if (0 < (int)uVar33) {
      iVar24 = 1 << (~local_4078.shift[2] & 0x1fU);
      lVar28 = 0;
      auVar35 = ZEXT416((uint)-iVar27);
      do {
        piVar5 = (int *)((long)output + lVar28);
        iVar27 = piVar5[1];
        iVar8 = piVar5[2];
        iVar9 = piVar5[3];
        piVar4 = (int *)((long)output + lVar28);
        *piVar4 = *piVar5 + iVar24 >> auVar35;
        piVar4[1] = iVar27 + iVar24 >> auVar35;
        piVar4[2] = iVar8 + iVar24 >> auVar35;
        piVar4[3] = iVar9 + iVar24 >> auVar35;
        lVar28 = lVar28 + 0x10;
      } while ((ulong)uVar33 << 4 != lVar28);
    }
  }
  else if (0 < (int)uVar33) {
    lVar28 = 0;
    do {
      piVar5 = (int *)((long)output + lVar28);
      iVar24 = piVar5[1];
      iVar8 = piVar5[2];
      iVar9 = piVar5[3];
      piVar4 = (int *)((long)output + lVar28);
      *piVar4 = *piVar5 << iVar27;
      piVar4[1] = iVar24;
      piVar4[2] = iVar8;
      piVar4[3] = iVar9;
      lVar28 = lVar28 + 0x10;
    } while ((ulong)uVar33 << 4 != lVar28);
  }
  return;
}

Assistant:

void av1_fwd_txfm2d_64x64_sse4_1(const int16_t *input, int32_t *output,
                                 int stride, TX_TYPE tx_type, int bd) {
  DECLARE_ALIGNED(16, int32_t, txfm_buf[4096]);
  TXFM_2D_FLIP_CFG cfg;
  av1_get_fwd_txfm_cfg(tx_type, TX_64X64, &cfg);
  (void)bd;
  fwd_txfm2d_64x64_sse4_1(input, output, stride, &cfg, txfm_buf);
}